

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQInteger sqstd_rex_charnode(SQRex *exp,SQBool isclass)

{
  char cVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  SQInteger SVar5;
  SQChar *error;
  long in_RSI;
  long in_RDI;
  SQRex *unaff_retaddr;
  SQInteger node_1;
  SQInteger node;
  SQChar ce;
  SQChar cb;
  SQChar t;
  SQChar *in_stack_ffffffffffffffc8;
  SQRex *in_stack_ffffffffffffffd0;
  undefined8 in_stack_fffffffffffffff8;
  SQRexNodeType type;
  
  type = (SQRexNodeType)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (**(char **)(in_RDI + 0x10) == '\\') {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    error = (SQChar *)(ulong)(uint)(int)**(char **)(in_RDI + 0x10);
    switch(error) {
    case (SQChar *)0x0:
      sqstd_rex_error(in_stack_ffffffffffffffd0,error);
      goto LAB_00152f4f;
    case (SQChar *)0x41:
    case (SQChar *)0x43:
    case (SQChar *)0x44:
    case (SQChar *)0x50:
    case (SQChar *)0x53:
    case (SQChar *)0x57:
    case (SQChar *)0x58:
    case (SQChar *)0x61:
    case (SQChar *)0x63:
    case (SQChar *)0x64:
    case (SQChar *)0x6c:
    case (SQChar *)0x70:
    case (SQChar *)0x73:
    case (SQChar *)0x75:
    case (SQChar *)0x77:
    case (SQChar *)0x78:
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      SVar5 = sqstd_rex_charclass(in_stack_ffffffffffffffd0,(SQInteger)error);
      break;
    case (SQChar *)0x42:
    case (SQChar *)0x62:
      if (in_RSI == 0) {
        SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
        *(long *)(*(long *)(in_RDI + 0x28) + SVar5 * 0x20 + 8) = (long)**(char **)(in_RDI + 0x10);
        *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
        return SVar5;
      }
    default:
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
      break;
    case (SQChar *)0x66:
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
      break;
    case (SQChar *)0x6d:
      lVar3 = *(long *)(in_RDI + 0x10);
      *(long *)(in_RDI + 0x10) = lVar3 + 1;
      cVar1 = *(char *)(lVar3 + 1);
      lVar3 = *(long *)(in_RDI + 0x10);
      *(long *)(in_RDI + 0x10) = lVar3 + 1;
      cVar2 = *(char *)(lVar3 + 1);
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      if ((cVar1 == '\0') || (cVar2 == '\0')) {
        sqstd_rex_error(in_stack_ffffffffffffffd0,error);
      }
      if (cVar1 == cVar2) {
        sqstd_rex_error(in_stack_ffffffffffffffd0,error);
      }
      SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
      *(long *)(*(long *)(in_RDI + 0x28) + SVar5 * 0x20 + 8) = (long)cVar1;
      *(long *)(*(long *)(in_RDI + 0x28) + SVar5 * 0x20 + 0x10) = (long)cVar2;
      break;
    case (SQChar *)0x6e:
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
      break;
    case (SQChar *)0x72:
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
      break;
    case (SQChar *)0x74:
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
      break;
    case (SQChar *)0x76:
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
    }
  }
  else {
    iVar4 = isprint((int)**(char **)(in_RDI + 0x10));
    if (iVar4 == 0) {
      sqstd_rex_error(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
LAB_00152f4f:
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
  }
  return SVar5;
}

Assistant:

static SQInteger sqstd_rex_charnode(SQRex *exp,SQBool isclass)
{
    SQChar t;
    if(*exp->_p == SQREX_SYMBOL_ESCAPE_CHAR) {
        exp->_p++;
        switch(*exp->_p) {
            case 'n': exp->_p++; return sqstd_rex_newnode(exp,'\n');
            case 't': exp->_p++; return sqstd_rex_newnode(exp,'\t');
            case 'r': exp->_p++; return sqstd_rex_newnode(exp,'\r');
            case 'f': exp->_p++; return sqstd_rex_newnode(exp,'\f');
            case 'v': exp->_p++; return sqstd_rex_newnode(exp,'\v');
            case 'a': case 'A': case 'w': case 'W': case 's': case 'S':
            case 'd': case 'D': case 'x': case 'X': case 'c': case 'C':
            case 'p': case 'P': case 'l': case 'u':
                {
                t = *exp->_p; exp->_p++;
                return sqstd_rex_charclass(exp,t);
                }
            case 'm':
                {
                     SQChar cb, ce; //cb = character begin match ce = character end match
                     cb = *++exp->_p; //skip 'm'
                     ce = *++exp->_p;
                     exp->_p++; //points to the next char to be parsed
                     if ((!cb) || (!ce)) sqstd_rex_error(exp,_SC("balanced chars expected"));
                     if ( cb == ce ) sqstd_rex_error(exp,_SC("open/close char can't be the same"));
                     SQInteger node =  sqstd_rex_newnode(exp,OP_MB);
                     exp->_nodes[node].left = cb;
                     exp->_nodes[node].right = ce;
                     return node;
                }
            case 0:
                sqstd_rex_error(exp,_SC("letter expected for argument of escape sequence"));
                break;                
            case 'b':
            case 'B':
                if(!isclass) {
                    SQInteger node = sqstd_rex_newnode(exp,OP_WB);
                    exp->_nodes[node].left = *exp->_p;
                    exp->_p++;
                    return node;
                } //else default
            default:
                t = *exp->_p; exp->_p++;
                return sqstd_rex_newnode(exp,t);
        }
    }
    else if(!scisprint(*exp->_p)) {

        sqstd_rex_error(exp,_SC("letter expected"));
    }
    t = *exp->_p; exp->_p++;
    return sqstd_rex_newnode(exp,t);
}